

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_loop_restoration_filter_frame
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,void *lr_ctxt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  RestorationLineBuffers *pRVar5;
  int32_t *piVar6;
  code *pcVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  undefined4 *puVar11;
  RestorationInfo *pRVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  int plane_h;
  int plane_w;
  int local_c0;
  int local_a8;
  int local_a4;
  ulong local_a0;
  AV1_COMMON *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long local_80;
  RestorationInfo *local_78;
  ulong local_70;
  undefined8 *local_68;
  RestorationLineBuffers *local_60;
  int32_t *local_58;
  code *local_50;
  long local_48;
  ulong local_40;
  aom_internal_error_info *local_38;
  
  uVar2 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  uVar16 = (ulong)uVar2;
  av1_loop_restoration_filter_frame_init((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,uVar2);
  local_80 = (long)lr_ctxt + 8;
  pRVar12 = cm->rst_info;
  uVar9 = 0;
  local_98 = cm;
  local_78 = pRVar12;
  local_70 = uVar16;
  local_68 = (undefined8 *)lr_ctxt;
  do {
    if (pRVar12[uVar9].frame_restoration_type != RESTORE_NONE) {
      if (uVar9 == 0) {
        bVar18 = false;
      }
      else {
        bVar18 = cm->seq_params->subsampling_y != 0;
      }
      local_50 = *lr_ctxt;
      local_58 = cm->rst_tmpbuf;
      local_60 = cm->rlbs;
      uVar2 = pRVar12[uVar9].restoration_unit_size;
      uVar15 = (ulong)uVar2;
      iVar1 = pRVar12[uVar9].horz_units;
      local_a0 = uVar9;
      av1_get_upsampled_plane_size(cm,(uint)(uVar9 != 0),&local_a4,&local_a8);
      iVar4 = local_a4;
      iVar3 = local_a8;
      uVar9 = local_a0;
      cm = local_98;
      pRVar12 = local_78;
      lr_ctxt = local_68;
      uVar16 = local_70;
      if (0 < local_a8) {
        lVar10 = local_a0 * 0x38 + local_80;
        iVar13 = (int)(uVar2 * 3) / 2;
        local_c0 = 0;
        iVar17 = 0;
        local_48 = lVar10;
        local_40 = uVar15;
        do {
          pcVar7 = local_50;
          piVar6 = local_58;
          pRVar5 = local_60;
          iVar14 = iVar3 - iVar17;
          if (iVar13 <= iVar14) {
            iVar14 = (int)uVar15;
          }
          iVar14 = iVar14 + iVar17;
          local_88 = iVar17 - (8U >> bVar18);
          if (local_88 < 1) {
            local_88 = 0;
          }
          local_84 = iVar14;
          if (iVar14 < iVar3) {
            local_84 = iVar14 - (8U >> bVar18);
          }
          if (0 < iVar4) {
            local_38 = local_98->error;
            iVar17 = local_c0;
            iVar8 = 0;
            do {
              local_90 = iVar8;
              iVar8 = iVar4 - local_90;
              if (iVar13 <= iVar8) {
                iVar8 = (int)uVar15;
              }
              iVar8 = local_90 + iVar8;
              local_8c = iVar8;
              (*pcVar7)(&local_90,iVar17,lVar10,piVar6,pRVar5,local_38);
              iVar17 = iVar17 + 1;
              lVar10 = local_48;
              uVar15 = local_40;
            } while (iVar8 < iVar4);
          }
          local_c0 = local_c0 + iVar1;
          uVar9 = local_a0;
          cm = local_98;
          pRVar12 = local_78;
          lr_ctxt = local_68;
          uVar16 = local_70;
          iVar17 = iVar14;
        } while (iVar14 < iVar3);
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != uVar16);
  puVar11 = (undefined4 *)((long)lr_ctxt + 0x1c);
  uVar9 = 0;
  do {
    if ((&pRVar12->frame_restoration_type)[uVar9 * 2] != RESTORE_NONE) {
      (**(code **)((long)&loop_restoration_copy_planes_copy_funs + uVar9))
                (*(undefined8 *)((long)lr_ctxt + 0xb8),*(undefined8 *)((long)lr_ctxt + 0xb0),0,
                 puVar11[-1],0,*puVar11);
    }
    uVar9 = uVar9 + 8;
    puVar11 = puVar11 + 0xe;
  } while ((uint)((int)uVar16 << 3) != uVar9);
  return;
}

Assistant:

void av1_loop_restoration_filter_frame(YV12_BUFFER_CONFIG *frame,
                                       AV1_COMMON *cm, int optimized_lr,
                                       void *lr_ctxt) {
  assert(!cm->features.all_lossless);
  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes(loop_rest_ctxt, cm, num_planes);

  loop_restoration_copy_planes(loop_rest_ctxt, cm, num_planes);
}